

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

Array<unsigned_char> *
kj::anon_unknown_65::readAll
          (Array<unsigned_char> *__return_storage_ptr__,InputStream *input,uint64_t limit,
          bool nulTerminate)

{
  RemoveConst<kj::Array<unsigned_char>_> *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  Array<unsigned_char> *p;
  Array<unsigned_char> *pAVar3;
  uchar *__dest;
  size_t sVar4;
  uchar *puVar5;
  Array<unsigned_char> part;
  Fault f_1;
  Vector<kj::Array<unsigned_char>_> parts;
  ulong __n;
  
  parts.builder.ptr = (Array<unsigned_char> *)0x0;
  parts.builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
  parts.builder.endPtr = (Array<unsigned_char> *)0x0;
  do {
    if (limit == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                ((Fault *)&part,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x4e,FAILED,"limit > 0","\"Reached limit before EOF.\"",
                 (char (*) [26])"Reached limit before EOF.");
      _::Debug::Fault::fatal((Fault *)&part);
    }
    sVar4 = 0x1000;
    if (limit < 0x1000) {
      sVar4 = limit;
    }
    part.ptr = _::HeapArrayDisposer::allocate<unsigned_char>(sVar4);
    part.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    part.size_ = sVar4;
    iVar2 = (*input->_vptr_InputStream[2])(input,part.ptr,sVar4);
    sVar4 = part.size_;
    __n = CONCAT44(extraout_var,iVar2);
    if (__n < part.size_) {
      heapArray<unsigned_char>
                (__return_storage_ptr__,
                 __n + (CONCAT71(in_register_00000009,nulTerminate) & 0xffffffff) +
                 (((long)parts.builder.pos - (long)parts.builder.ptr) / 0x18) * 0x1000);
      pRVar1 = parts.builder.pos;
      __dest = __return_storage_ptr__->ptr;
      puVar5 = __dest + __n;
      for (pAVar3 = parts.builder.ptr; pAVar3 != pRVar1; pAVar3 = pAVar3 + 1) {
        memcpy(__dest,pAVar3->ptr,0x1000);
        __dest = __dest + 0x1000;
        puVar5 = puVar5 + 0x1000;
      }
      memcpy(__dest,part.ptr,__n);
      if (nulTerminate) {
        *puVar5 = '\0';
        puVar5 = puVar5 + 1;
      }
      if (puVar5 != __return_storage_ptr__->ptr + __return_storage_ptr__->size_) {
        _::Debug::Fault::Fault
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                   ,0x5c,FAILED,"pos == result.end()","");
        _::Debug::Fault::fatal(&f_1);
      }
    }
    else {
      Vector<kj::Array<unsigned_char>>::add<kj::Array<unsigned_char>>
                ((Vector<kj::Array<unsigned_char>> *)&parts,&part);
    }
    limit = limit - __n;
    Array<unsigned_char>::~Array(&part);
    if (__n < sVar4) {
      ArrayBuilder<kj::Array<unsigned_char>_>::dispose(&parts.builder);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Array<byte> readAll(InputStream& input, uint64_t limit, bool nulTerminate) {
  Vector<Array<byte>> parts;
  constexpr size_t BLOCK_SIZE = 4096;

  for (;;) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");
    auto part = heapArray<byte>(kj::min(BLOCK_SIZE, limit));
    size_t n = input.tryRead(part.begin(), part.size(), part.size());
    limit -= n;
    if (n < part.size()) {
      auto result = heapArray<byte>(parts.size() * BLOCK_SIZE + n + nulTerminate);
      byte* pos = result.begin();
      for (auto& p: parts) {
        memcpy(pos, p.begin(), BLOCK_SIZE);
        pos += BLOCK_SIZE;
      }
      memcpy(pos, part.begin(), n);
      pos += n;
      if (nulTerminate) *pos++ = '\0';
      KJ_ASSERT(pos == result.end());
      return result;
    } else {
      parts.add(kj::mv(part));
    }
  }
}